

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O0

time_t lws_tls_openssl_asn1time_to_unix(ASN1_TIME *as)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  time_t tVar6;
  undefined1 local_50 [8];
  tm t;
  char *p;
  ASN1_TIME *as_local;
  
  t.tm_zone = (char *)as->data;
  memset(local_50,0,0x38);
  sVar5 = strlen(t.tm_zone);
  if (sVar5 == 0xd) {
    iVar1 = dec(*t.tm_zone);
    iVar2 = dec(t.tm_zone[1]);
    t.tm_mday = iVar1 * 10 + iVar2 + 100;
    t.tm_zone = t.tm_zone + 2;
  }
  else {
    iVar1 = dec(*t.tm_zone);
    iVar2 = dec(t.tm_zone[1]);
    iVar3 = dec(t.tm_zone[2]);
    iVar4 = dec(t.tm_zone[3]);
    t.tm_mday = iVar1 * 1000 + iVar2 * 100 + iVar3 * 10 + iVar4;
    t.tm_zone = t.tm_zone + 4;
  }
  iVar1 = dec(*t.tm_zone);
  iVar2 = dec(t.tm_zone[1]);
  t.tm_hour = iVar1 * 10 + iVar2 + -1;
  t.tm_zone = t.tm_zone + 2;
  iVar1 = dec(*t.tm_zone);
  iVar2 = dec(t.tm_zone[1]);
  t.tm_min = iVar1 * 10 + iVar2 + -1;
  t.tm_zone = t.tm_zone + 2;
  iVar1 = dec(*t.tm_zone);
  iVar2 = dec(t.tm_zone[1]);
  t.tm_sec = iVar1 * 10 + iVar2;
  t.tm_zone = t.tm_zone + 2;
  iVar1 = dec(*t.tm_zone);
  local_50._4_4_ = dec(t.tm_zone[1]);
  local_50._4_4_ = iVar1 * 10 + local_50._4_4_;
  t.tm_zone = t.tm_zone + 2;
  iVar1 = dec(*t.tm_zone);
  local_50._0_4_ = dec(t.tm_zone[1]);
  local_50._0_4_ = iVar1 * 10 + local_50._0_4_;
  t.tm_wday = 0;
  tVar6 = mktime((tm *)local_50);
  return tVar6;
}

Assistant:

static time_t
lws_tls_openssl_asn1time_to_unix(ASN1_TIME *as)
{
#if !defined(LWS_PLAT_OPTEE)

	const char *p = (const char *)as->data;
	struct tm t;

	/* [YY]YYMMDDHHMMSSZ */

	memset(&t, 0, sizeof(t));

	if (strlen(p) == 13) {
		t.tm_year = (dec(p[0]) * 10) + dec(p[1]) + 100;
		p += 2;
	} else {
		t.tm_year = (dec(p[0]) * 1000) + (dec(p[1]) * 100) +
			    (dec(p[2]) * 10) + dec(p[3]);
		p += 4;
	}
	t.tm_mon = (dec(p[0]) * 10) + dec(p[1]) - 1;
	p += 2;
	t.tm_mday = (dec(p[0]) * 10) + dec(p[1]) - 1;
	p += 2;
	t.tm_hour = (dec(p[0]) * 10) + dec(p[1]);
	p += 2;
	t.tm_min = (dec(p[0]) * 10) + dec(p[1]);
	p += 2;
	t.tm_sec = (dec(p[0]) * 10) + dec(p[1]);
	t.tm_isdst = 0;

	return mktime(&t);
#else
	return (time_t)-1;
#endif
}